

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

TValue * cpcall(lua_State *L,lua_CFunction func,void *ud)

{
  TValue *pTVar1;
  GCfunc *pGVar2;
  void *pvVar3;
  ulong uVar4;
  GCRef *pGVar5;
  
  uVar4 = L->base[-2].u64 & 0x7fffffffffff;
  pGVar5 = &L->env;
  if (*(char *)(uVar4 + 9) == '\b') {
    pGVar5 = (GCRef *)(uVar4 + 0x10);
  }
  pGVar2 = lj_func_newC(L,0,(GCtab *)pGVar5->gcptr64);
  pTVar1 = L->top;
  (pGVar2->c).f = func;
  pTVar1->u64 = (ulong)pGVar2 | 0xfffb800000000000;
  pTVar1[1].u64 = 0xffffffffffffffff;
  pvVar3 = lj_lightud_intern(L,ud);
  pTVar1[2].u64 = (ulong)pvVar3 | 0xfffe000000000000;
  *(undefined4 *)((long)L->cframe + 8) = 1;
  L->top = pTVar1 + 3;
  return pTVar1 + 2;
}

Assistant:

static TValue *cpcall(lua_State *L, lua_CFunction func, void *ud)
{
  GCfunc *fn = lj_func_newC(L, 0, getcurrenv(L));
  TValue *top = L->top;
  fn->c.f = func;
  setfuncV(L, top++, fn);
  if (LJ_FR2) setnilV(top++);
#if LJ_64
  ud = lj_lightud_intern(L, ud);
#endif
  setrawlightudV(top++, ud);
  cframe_nres(L->cframe) = 1+0;  /* Zero results. */
  L->top = top;
  return top-1;  /* Now call the newly allocated C function. */
}